

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_strand_array.h
# Opt level: O2

void __thiscall
embree::sse2::HeuristicStrandSplit::split
          (HeuristicStrandSplit *this,Split *split,PrimInfoRange *set,PrimInfoRange *lset,
          PrimInfoRange *rset)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  PrimRef *pPVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  PrimRef *prim;
  PrimRef *prim_00;
  long lVar10;
  anon_class_8_1_8991fb9c mergePrimBounds;
  CentGeomBBox3fa local_left;
  CentGeomBBox3fa local_right;
  anon_class_16_2_f8825c07 primOnLeftSide;
  anon_class_8_1_8991fb9c local_d0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_class_16_2_f8825c07 local_40;
  
  if (INFINITY <= split->sah) {
    deterministic_order(this,&set->super_range<unsigned_long>);
    splitFallback(this,&set->super_range<unsigned_long>,lset,rset);
    return;
  }
  uVar1 = (set->super_range<unsigned_long>)._begin;
  uVar2 = (set->super_range<unsigned_long>)._end;
  local_c8._0_8_ = 0x7f8000007f800000;
  local_c8._8_8_ = 0x7f8000007f800000;
  local_b8 = 0xff800000ff800000;
  uStack_b0 = 0xff800000ff800000;
  local_a8 = 0x7f8000007f800000;
  uStack_a0 = 0x7f8000007f800000;
  local_98 = 0xff800000ff800000;
  uStack_90 = 0xff800000ff800000;
  local_88._0_8_ = 0x7f8000007f800000;
  local_88._8_8_ = 0x7f8000007f800000;
  local_78 = 0xff800000ff800000;
  uStack_70 = 0xff800000ff800000;
  local_68 = 0x7f8000007f800000;
  uStack_60 = 0x7f8000007f800000;
  local_58 = 0xff800000ff800000;
  uStack_50 = 0xff800000ff800000;
  pPVar3 = this->prims;
  prim = pPVar3 + uVar1;
  prim_00 = pPVar3 + uVar2;
  local_d0.this = this;
  local_40.this = this;
  local_40.split = split;
  do {
    prim_00 = prim_00 + -1;
    lVar10 = (long)prim - (long)pPVar3;
    for (; prim <= prim_00; prim = prim + 1) {
      bVar9 = HeuristicStrandSplit::split::anon_class_16_2_f8825c07::operator()(&local_40,prim);
      if (!bVar9) break;
      HeuristicStrandSplit::split::anon_class_8_1_8991fb9c::operator()
                (&local_d0,(CentGeomBBox3fa *)&local_c8.field_1,prim);
      lVar10 = lVar10 + 0x20;
    }
    while( true ) {
      if (prim_00 < prim) {
        *(undefined8 *)&(lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = local_c8._0_8_;
        *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
             local_c8._8_8_;
        *(undefined8 *)&(lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = local_b8;
        *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) =
             uStack_b0;
        *(undefined8 *)&(lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = local_a8;
        *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) =
             uStack_a0;
        *(undefined8 *)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_98;
        *(undefined8 *)((long)&(lset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
             uStack_90;
        (lset->super_range<unsigned_long>)._begin = uVar1;
        (lset->super_range<unsigned_long>)._end = lVar10 >> 5;
        *(undefined8 *)&(rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = local_88._0_8_;
        *(undefined8 *)((long)&(rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 + 8) =
             local_88._8_8_;
        *(undefined8 *)&(rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = local_78;
        *(undefined8 *)((long)&(rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 + 8) =
             uStack_70;
        *(undefined8 *)&(rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = local_68;
        *(undefined8 *)((long)&(rset->super_CentGeomBBox3fa).centBounds.lower.field_0 + 8) =
             uStack_60;
        *(undefined8 *)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = local_58;
        *(undefined8 *)((long)&(rset->super_CentGeomBBox3fa).centBounds.upper.field_0 + 8) =
             uStack_50;
        (rset->super_range<unsigned_long>)._begin = lVar10 >> 5;
        (rset->super_range<unsigned_long>)._end = uVar2;
        return;
      }
      bVar9 = HeuristicStrandSplit::split::anon_class_16_2_f8825c07::operator()(&local_40,prim_00);
      if (bVar9) break;
      HeuristicStrandSplit::split::anon_class_8_1_8991fb9c::operator()
                (&local_d0,(CentGeomBBox3fa *)&local_88.field_1,prim_00);
      prim_00 = prim_00 + -1;
    }
    HeuristicStrandSplit::split::anon_class_8_1_8991fb9c::operator()
              (&local_d0,(CentGeomBBox3fa *)&local_c8.field_1,prim_00);
    HeuristicStrandSplit::split::anon_class_8_1_8991fb9c::operator()
              (&local_d0,(CentGeomBBox3fa *)&local_88.field_1,prim);
    uVar4 = *(undefined8 *)&(prim->lower).field_0;
    uVar5 = *(undefined8 *)((long)&(prim->lower).field_0 + 8);
    uVar6 = *(undefined8 *)&(prim->upper).field_0;
    uVar7 = *(undefined8 *)((long)&(prim->upper).field_0 + 8);
    uVar8 = *(undefined8 *)((long)&(prim_00->lower).field_0 + 8);
    *(undefined8 *)&(prim->lower).field_0 = *(undefined8 *)&(prim_00->lower).field_0;
    *(undefined8 *)((long)&(prim->lower).field_0 + 8) = uVar8;
    uVar8 = *(undefined8 *)((long)&(prim_00->upper).field_0 + 8);
    *(undefined8 *)&(prim->upper).field_0 = *(undefined8 *)&(prim_00->upper).field_0;
    *(undefined8 *)((long)&(prim->upper).field_0 + 8) = uVar8;
    *(undefined8 *)&(prim_00->lower).field_0 = uVar4;
    *(undefined8 *)((long)&(prim_00->lower).field_0 + 8) = uVar5;
    *(undefined8 *)&(prim_00->upper).field_0 = uVar6;
    *(undefined8 *)((long)&(prim_00->upper).field_0 + 8) = uVar7;
    prim = prim + 1;
  } while( true );
}

Assistant:

void split(const Split& split, const PrimInfoRange& set, PrimInfoRange& lset, PrimInfoRange& rset) 
      {
        if (!split.valid()) {
          deterministic_order(set);
          return splitFallback(set,lset,rset);
        }
        
        const size_t begin = set.begin();
        const size_t end   = set.end();
        CentGeomBBox3fa local_left(empty);
        CentGeomBBox3fa local_right(empty);

        auto primOnLeftSide = [&] (const PrimRef& prim) -> bool { 
          const Vec3fa axisi = normalize(direction(prim));
          const float cos0 = abs(dot(axisi,split.axis0));
          const float cos1 = abs(dot(axisi,split.axis1));
          return cos0 > cos1;
        };

        auto mergePrimBounds = [this] (CentGeomBBox3fa& pinfo,const PrimRef& ref) { 
          pinfo.extend(bounds(ref)); 
        };
        
        size_t center = serial_partitioning(prims,begin,end,local_left,local_right,primOnLeftSide,mergePrimBounds);
        
        new (&lset) PrimInfoRange(begin,center,local_left);
        new (&rset) PrimInfoRange(center,end,local_right);
        assert(area(lset.geomBounds) >= 0.0f);
        assert(area(rset.geomBounds) >= 0.0f);
      }